

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  Address(this,type,witness_ver,tree,internal_pubkey,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey)
    : Address(type, witness_ver, tree, internal_pubkey, "") {
  // do nothing
}